

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer.cpp
# Opt level: O2

void __thiscall dynamicgraph::Tracer::closeFiles(Tracer *this)

{
  FileList *this_00;
  _List_node_base *p_Var1;
  
  std::mutex::lock(&this->files_mtx);
  this_00 = &this->files;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        (_List_node_base *)this_00 != p_Var1) {
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_next + 8))();
    }
  }
  std::__cxx11::
  list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::clear(this_00);
  pthread_mutex_unlock((pthread_mutex_t *)&this->files_mtx);
  return;
}

Assistant:

void Tracer::closeFiles() {
  dgDEBUGIN(15);
  std::lock_guard<std::mutex> files_lock(files_mtx);

  for (FileList::iterator iter = files.begin(); files.end() != iter; ++iter) {
    std::ostream *filePtr = *iter;
    delete filePtr;
  }
  files.clear();

  dgDEBUGOUT(15);
}